

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<double>_>::Print
          (TPZMatrix<Fad<double>_> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  Fad<double> local_50;
  
  poVar1 = std::operator<<(out,name);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar3 = 0; lVar3 < (this->super_TPZBaseMatrix).fRow; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 < (this->super_TPZBaseMatrix).fCol; lVar2 = lVar2 + 1) {
      poVar1 = std::operator<<(out,"i = ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1," j = ");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1," val ");
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                (&local_50,this,lVar3,lVar2);
      poVar1 = ::operator<<(poVar1,&local_50);
      std::endl<char,std::char_traits<char>>(poVar1);
      Fad<double>::~Fad(&local_50);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}